

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.hpp
# Opt level: O3

void cpp_properties::encode_latin1_to_utf8<char>
               (char code_point,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *utf8)

{
  if (code_point < '\0') {
    std::__cxx11::string::push_back((char)utf8);
  }
  std::__cxx11::string::push_back((char)utf8);
  return;
}

Assistant:

void encode_latin1_to_utf8(const CharT code_point, std::basic_string<CharT> &utf8) {
  /* code points above 0xff are impossible since iso 8859-1 is 8-bit encoded */
  uint8_t ch = code_point;

  if (ch < 0x80) {
    utf8 += ch;
  } else {
    utf8 += 0xc0 | (ch & 0xc0) >> 6; // first byte
    utf8 += 0x80 | (ch & 0x3f);      // last byte
  }
}